

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tztrans.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeZoneTransition::operator==(TimeZoneTransition *this,TimeZoneTransition *that)

{
  bool bVar1;
  int iVar2;
  TimeZoneTransition *that_local;
  TimeZoneTransition *this_local;
  
  if (this == that) {
    this_local._7_1_ = '\x01';
  }
  else {
    if (this == (TimeZoneTransition *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = '\0';
    }
    else if ((this->fTime != that->fTime) || (NAN(this->fTime) || NAN(that->fTime))) {
      this_local._7_1_ = '\0';
    }
    else if ((((this->fFrom == (TimeZoneRule *)0x0) && (that->fFrom == (TimeZoneRule *)0x0)) ||
             ((this->fFrom != (TimeZoneRule *)0x0 &&
              ((that->fFrom != (TimeZoneRule *)0x0 &&
               (iVar2 = (*(this->fFrom->super_UObject)._vptr_UObject[4])(this->fFrom,that->fFrom),
               (char)iVar2 != '\0')))))) &&
            (((this->fTo == (TimeZoneRule *)0x0 && (that->fTo == (TimeZoneRule *)0x0)) ||
             (((this->fTo != (TimeZoneRule *)0x0 && (that->fTo != (TimeZoneRule *)0x0)) &&
              (iVar2 = (*(this->fTo->super_UObject)._vptr_UObject[4])(this->fTo,that->fTo),
              (char)iVar2 != '\0')))))) {
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeZoneTransition::operator==(const TimeZoneTransition& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }
    if (fTime != that.fTime) {
        return FALSE;
    }
    if ((fFrom == NULL && that.fFrom == NULL)
        || (fFrom != NULL && that.fFrom != NULL && *fFrom == *(that.fFrom))) {
        if ((fTo == NULL && that.fTo == NULL)
            || (fTo != NULL && that.fTo != NULL && *fTo == *(that.fTo))) {
            return TRUE;
        }
    }
    return FALSE;
}